

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

OPJ_BOOL opj_tcd_copy_tile_data(opj_tcd_t *p_tcd,OPJ_BYTE *p_src,OPJ_SIZE_T p_src_length)

{
  ushort uVar1;
  opj_image_t *poVar2;
  OPJ_INT32 *pOVar3;
  OPJ_BOOL OVar4;
  OPJ_SIZE_T OVar5;
  opj_image_comp_t *poVar6;
  opj_tcd_tilecomp_t *poVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  OVar5 = opj_tcd_get_encoded_tile_size(p_tcd);
  OVar4 = 0;
  if (OVar5 == p_src_length) {
    poVar2 = p_tcd->image;
    OVar4 = 1;
    if (poVar2->numcomps != 0) {
      poVar6 = poVar2->comps;
      poVar7 = p_tcd->tcd_image->tiles->comps;
      uVar8 = 0;
      do {
        lVar9 = (long)(poVar7->y1 - poVar7->y0) * (long)(poVar7->x1 - poVar7->x0);
        iVar10 = ((poVar6->prec >> 3) + 1) - (uint)((poVar6->prec & 7) == 0);
        if (iVar10 == 3) {
          iVar10 = 4;
        }
        if (iVar10 == 4) {
          if (lVar9 != 0) {
            pOVar3 = poVar7->data;
            lVar11 = 0;
            lVar12 = 0;
            do {
              pOVar3[lVar12] = *(OPJ_INT32 *)((long)p_src + lVar12 * 2 * 2);
              lVar12 = lVar12 + 1;
              lVar11 = lVar11 + -4;
            } while (lVar9 - lVar12 != 0);
            p_src = (OPJ_BYTE *)((long)p_src - lVar11);
          }
        }
        else if (iVar10 == 2) {
          pOVar3 = poVar7->data;
          if (poVar6->sgnd == 0) {
            if (lVar9 != 0) {
              lVar11 = 0;
              do {
                uVar1 = *(ushort *)p_src;
                p_src = (OPJ_BYTE *)((long)p_src + 2);
                pOVar3[lVar11] = (uint)uVar1;
                lVar11 = lVar11 + 1;
              } while (lVar9 - lVar11 != 0);
            }
          }
          else if (lVar9 != 0) {
            lVar11 = 0;
            do {
              uVar1 = *(ushort *)p_src;
              p_src = (OPJ_BYTE *)((long)p_src + 2);
              pOVar3[lVar11] = (int)(short)uVar1;
              lVar11 = lVar11 + 1;
            } while (lVar9 - lVar11 != 0);
          }
        }
        else if (iVar10 == 1) {
          pOVar3 = poVar7->data;
          if (poVar6->sgnd == 0) {
            if (lVar9 != 0) {
              lVar11 = 0;
              do {
                pOVar3[lVar11] = (uint)*(byte *)((long)p_src + lVar11);
                lVar11 = lVar11 + 1;
              } while (lVar9 - lVar11 != 0);
              goto LAB_00139f61;
            }
          }
          else if (lVar9 != 0) {
            lVar11 = 0;
            do {
              pOVar3[lVar11] = (int)*(char *)((long)p_src + lVar11);
              lVar11 = lVar11 + 1;
            } while (lVar9 - lVar11 != 0);
LAB_00139f61:
            p_src = (OPJ_BYTE *)((long)p_src + lVar11);
          }
        }
        poVar6 = poVar6 + 1;
        poVar7 = poVar7 + 1;
        uVar8 = uVar8 + 1;
      } while (uVar8 < poVar2->numcomps);
    }
  }
  return OVar4;
}

Assistant:

OPJ_BOOL opj_tcd_copy_tile_data(opj_tcd_t *p_tcd,
                                OPJ_BYTE * p_src,
                                OPJ_SIZE_T p_src_length)
{
    OPJ_UINT32 i;
    OPJ_SIZE_T j;
    OPJ_SIZE_T l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_SIZE_T l_nb_elem;

    l_data_size = opj_tcd_get_encoded_tile_size(p_tcd);
    if (l_data_size != p_src_length) {
        return OPJ_FALSE;
    }

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;
    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */
        l_nb_elem = (OPJ_SIZE_T)(l_tilec->x1 - l_tilec->x0) *
                    (OPJ_SIZE_T)(l_tilec->y1 - l_tilec->y0);

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        switch (l_size_comp) {
        case 1: {
            OPJ_CHAR * l_src_ptr = (OPJ_CHAR *) p_src;
            OPJ_INT32 * l_dest_ptr = l_tilec->data;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (OPJ_INT32)(*(l_src_ptr++));
                }
            } else {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (*(l_src_ptr++)) & 0xff;
                }
            }

            p_src = (OPJ_BYTE*) l_src_ptr;
        }
        break;
        case 2: {
            OPJ_INT32 * l_dest_ptr = l_tilec->data;
            OPJ_INT16 * l_src_ptr = (OPJ_INT16 *) p_src;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (OPJ_INT32)(*(l_src_ptr++));
                }
            } else {
                for (j = 0; j < l_nb_elem; ++j) {
                    *(l_dest_ptr++) = (*(l_src_ptr++)) & 0xffff;
                }
            }

            p_src = (OPJ_BYTE*) l_src_ptr;
        }
        break;
        case 4: {
            OPJ_INT32 * l_src_ptr = (OPJ_INT32 *) p_src;
            OPJ_INT32 * l_dest_ptr = l_tilec->data;

            for (j = 0; j < l_nb_elem; ++j) {
                *(l_dest_ptr++) = (OPJ_INT32)(*(l_src_ptr++));
            }

            p_src = (OPJ_BYTE*) l_src_ptr;
        }
        break;
        }

        ++l_img_comp;
        ++l_tilec;
    }

    return OPJ_TRUE;
}